

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

double units::readTeens(string *str,size_t *index)

{
  ulong uVar1;
  int iVar2;
  const_iterator pvVar3;
  __tuple_element_t<2UL,_tuple<const_char_*,_double,_int>_> *p_Var4;
  __tuple_element_t<1UL,_tuple<const_char_*,_double,_int>_> *p_Var5;
  value_type *num;
  const_iterator __end1;
  const_iterator __begin1;
  array<std::tuple<const_char_*,_double,_int>,_11UL> *__range1;
  size_t *index_local;
  string *str_local;
  
  __end1 = std::array<std::tuple<const_char_*,_double,_int>,_11UL>::begin
                     ((array<std::tuple<const_char_*,_double,_int>,_11UL> *)teens);
  pvVar3 = std::array<std::tuple<const_char_*,_double,_int>,_11UL>::end
                     ((array<std::tuple<const_char_*,_double,_int>,_11UL> *)teens);
  while( true ) {
    if (__end1 == pvVar3) {
      return NAN;
    }
    uVar1 = *index;
    p_Var4 = std::get<2ul,char_const*,double,int>(__end1);
    iVar2 = *p_Var4;
    std::get<0ul,char_const*,double,int>(__end1);
    iVar2 = std::__cxx11::string::compare((ulong)str,uVar1,(char *)(long)iVar2);
    if (iVar2 == 0) break;
    __end1 = __end1 + 1;
  }
  p_Var4 = std::get<2ul,char_const*,double,int>(__end1);
  *index = (long)*p_Var4 + *index;
  p_Var5 = std::get<1ul,char_const*,double,int>(__end1);
  return *p_Var5;
}

Assistant:

static double readTeens(const std::string& str, size_t& index)
{
    for (const auto& num : teens) {
        if (str.compare(index, std::get<2>(num), std::get<0>(num)) == 0) {
            index += std::get<2>(num);
            return std::get<1>(num);
        }
    }
    return constants::invalid_conversion;
}